

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O3

void kj::_::throwDoubleAdd(void)

{
  char (*in_RCX) [70];
  String SStack_1b8;
  Exception local_1a0;
  
  Debug::makeDescription<char_const(&)[70]>
            (&SStack_1b8,
             (Debug *)"\"tried to add element to kj::List but the element is already in a list\"",
             "tried to add element to kj::List but the element is already in a list",in_RCX);
  Exception::Exception
            (&local_1a0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x1e,&SStack_1b8);
  throwFatalException(&local_1a0,0);
}

Assistant:

void throwDoubleAdd() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "tried to add element to kj::List but the element is already in a list"));
}